

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O1

_out_ch_desc *
gl3cts::TextureSwizzle::get_descriptor_for_channel(_texture_format *format,size_t channel)

{
  _out_ch_desc *p_Var1;
  TestError *this;
  
  switch(channel) {
  case 0:
    p_Var1 = &format->m_red_ch;
    break;
  case 1:
    p_Var1 = &format->m_green_ch;
    break;
  case 2:
    p_Var1 = &format->m_blue_ch;
    break;
  case 3:
    p_Var1 = &format->m_alpha_ch;
    break;
  case 4:
    p_Var1 = format->m_one_ch;
    break;
  case 5:
    p_Var1 = format->m_zero_ch;
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Invalid value",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0x78b);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (p_Var1->m_internal_format == 0) {
    p_Var1 = format->m_zero_ch;
  }
  else if (p_Var1->m_internal_format == 1) {
    p_Var1 = format->m_one_ch;
  }
  return p_Var1;
}

Assistant:

const _out_ch_desc& get_descriptor_for_channel(const _texture_format& format, const size_t channel)
{
	const _out_ch_desc* desc = 0;

	switch (channel)
	{
	case CHANNEL_INDEX_ONE:
		desc = &format.m_one_ch;
		break;
	case CHANNEL_INDEX_ZERO:
		desc = &format.m_zero_ch;
		break;
	case 0:
		desc = &format.m_red_ch;
		break;
	case 1:
		desc = &format.m_green_ch;
		break;
	case 2:
		desc = &format.m_blue_ch;
		break;
	case 3:
		desc = &format.m_alpha_ch;
		break;
	default:
		TCU_FAIL("Invalid value");
		break;
	};

	switch (desc->m_internal_format)
	{
	case GL_ONE:
		desc = &format.m_one_ch;
		break;
	case GL_ZERO:
		desc = &format.m_zero_ch;
		break;
	default:
		break;
	}

	return *desc;
}